

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O3

vrna_exp_param_t * get_exp_params_ali(vrna_md_t *md,uint n_seq,double pfs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  vrna_exp_param_t *pvVar10;
  long lVar11;
  size_t sVar12;
  int (*paaiVar13) [5] [5];
  long lVar14;
  int (*paaiVar15) [5] [5];
  int (*paaiVar16) [5] [5];
  int m_1;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  double (*padVar20) [5];
  double (*padVar21) [8];
  int (*paaiVar22) [5] [5];
  double (*paaadVar23) [8] [5] [5];
  double (*paaadVar24) [8] [5] [5];
  double (*paaadVar25) [8] [5] [5];
  double (*paaaadVar26) [8] [5] [5] [5];
  double (*paaaadVar27) [8] [5] [5] [5];
  double (*paaaadVar28) [8] [5] [5] [5];
  double (*paaaadVar29) [8] [5] [5] [5];
  int (*paaiVar30) [5] [5];
  int (*paaiVar31) [5] [5];
  int (*paaiVar32) [5] [5];
  int (*paaiVar33) [5] [5];
  int (*paaiVar34) [5] [5];
  int (*paaiVar35) [5] [5];
  int (*paiVar36) [5];
  vrna_exp_param_t *pvVar37;
  vrna_exp_param_t *pvVar38;
  int (*paaaaiVar39) [8] [5] [5] [5];
  int (*paiVar40) [5];
  double (*paaaaadVar41) [8] [5] [5] [5] [5];
  double (*paaaaadVar42) [8] [5] [5] [5] [5];
  double (*paaaaadVar43) [8] [5] [5] [5] [5];
  double (*paaaaadVar44) [8] [5] [5] [5] [5];
  double (*paaaaadVar45) [8] [5] [5] [5] [5];
  int m;
  int iVar46;
  int (*paiVar47) [5];
  int (*paaiVar48) [5] [5];
  long lVar49;
  long lVar50;
  ulong uVar51;
  long lVar52;
  int (*paiVar53) [8];
  int (*paaiVar54) [5] [5];
  int (*paaaiVar55) [8] [5] [5];
  int (*paaaaaiVar56) [8] [5] [5] [5] [5];
  int (*paiVar57) [5];
  int (*paiVar58) [5];
  int (*paiVar59) [8];
  long lVar60;
  int (*paaaiVar61) [8] [5] [5];
  int (*paaaaiVar62) [8] [5] [5] [5];
  int (*paaaaaiVar63) [8] [5] [5] [5] [5];
  int (*paiVar64) [5];
  int (*paiVar65) [5];
  int (*paiVar66) [5];
  undefined4 uVar67;
  undefined4 uVar68;
  double dVar69;
  double dVar70;
  int (*local_130) [5];
  int (*local_100) [5];
  int (*local_f0) [5];
  int (*local_e8) [5];
  int (*local_e0) [5];
  int (*local_d8) [5];
  int (*local_c8) [5];
  int (*local_b8) [5];
  int (*local_b0) [5];
  
  pvVar10 = (vrna_exp_param_t *)vrna_alloc(0x66760);
  memcpy(&pvVar10->model_details,md,0x7e8);
  uVar1 = md->temperature;
  uVar2 = md->betaScale;
  pvVar10->temperature = (double)uVar1;
  pvVar10->alpha = (double)uVar2;
  pvVar10->pf_scale = pfs;
  dVar5 = (double)uVar2 * (double)n_seq * ((double)uVar1 + 273.15) * 1.98717;
  pvVar10->kT = dVar5;
  iVar3 = md->pf_smooth;
  dVar7 = ((double)uVar1 + 273.15) / Tmeasure;
  pvVar10->lxc = lxc37 * dVar7;
  dVar69 = (double)DuplexInitdH - (double)(DuplexInitdH - DuplexInit37) * dVar7;
  if (iVar3 == 0) {
    dVar69 = (double)(int)dVar69;
  }
  dVar69 = exp((dVar69 * -10.0) / dVar5);
  pvVar10->expDuplexInit = dVar69;
  dVar69 = (double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dVar7;
  if (iVar3 == 0) {
    dVar69 = (double)(int)dVar69;
  }
  dVar69 = exp((dVar69 * -10.0) / dVar5);
  pvVar10->expTermAU = dVar69;
  dVar69 = (double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dVar7;
  if (iVar3 == 0) {
    dVar69 = (double)(int)dVar69;
  }
  dVar69 = exp(((dVar69 * -10.0) / dVar5) / (double)n_seq);
  pvVar10->expMLbase = dVar69;
  dVar69 = (double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dVar7;
  if (iVar3 == 0) {
    dVar69 = (double)(int)dVar69;
  }
  dVar69 = exp((dVar69 * -10.0) / dVar5);
  pvVar10->expMLclosing = dVar69;
  dVar69 = (double)GQuadLayerMismatchH -
           (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar7;
  if (iVar3 == 0) {
    dVar69 = (double)(int)dVar69;
  }
  dVar69 = exp((dVar69 * -10.0) / dVar5);
  pvVar10->expgquadLayerMismatch = dVar69;
  pvVar10->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  local_100 = (int (*) [5])(pvVar10->expgquad[2] + 3);
  lVar11 = 2;
  do {
    lVar52 = 0;
    do {
      iVar8 = GQuadBetadH;
      iVar9 = GQuadAlphadH;
      iVar46 = GQuadAlphadH - GQuadAlpha37;
      iVar17 = GQuadBetadH - GQuadBeta37;
      lVar60 = lVar52 + 1;
      dVar69 = log((double)(int)lVar60);
      dVar69 = ((double)iVar8 - (double)iVar17 * dVar7) * dVar69 +
               ((double)iVar9 - (double)iVar46 * dVar7) * (double)((int)lVar11 - 1);
      if (iVar3 == 0) {
        dVar69 = (double)(int)dVar69;
      }
      dVar69 = exp((dVar69 * -10.0) / dVar5);
      *(double *)((long)local_100 + lVar52 * 8) = dVar69;
      lVar52 = lVar60;
    } while (lVar60 != 0x2b);
    lVar11 = lVar11 + 1;
    local_100 = (int (*) [5])((long)local_100 + 0x170);
  } while (lVar11 != 8);
  lVar11 = 0;
  do {
    dVar69 = (double)hairpindH[lVar11] - (double)(hairpindH[lVar11] - hairpin37[lVar11]) * dVar7;
    if (iVar3 == 0) {
      dVar69 = (double)(int)dVar69;
    }
    dVar69 = exp((dVar69 * -10.0) / dVar5);
    pvVar10->exphairpin[lVar11] = dVar69;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x1f);
  lVar11 = 0;
  do {
    dVar69 = exp((dVar7 * -600.0 * 10.0) / dVar5);
    pvVar10->exphairpin[lVar11] = dVar69;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  lVar11 = 0;
  do {
    dVar69 = (double)*(int *)((long)bulgedH + lVar11) -
             (double)(*(int *)((long)bulgedH + lVar11) - *(int *)((long)bulge37 + lVar11)) * dVar7;
    if (iVar3 == 0) {
      dVar69 = (double)(int)dVar69;
    }
    dVar69 = exp((dVar69 * -10.0) / dVar5);
    *(double *)((long)pvVar10->expbulge + lVar11 * 2) = dVar69;
    dVar69 = (double)*(int *)((long)internal_loopdH + lVar11) -
             (double)(*(int *)((long)internal_loopdH + lVar11) -
                     *(int *)((long)internal_loop37 + lVar11)) * dVar7;
    if (iVar3 == 0) {
      dVar69 = (double)(int)dVar69;
    }
    dVar69 = exp((dVar69 * -10.0) / dVar5);
    *(double *)((long)pvVar10->expinternal + lVar11 * 2) = dVar69;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x7c);
  if (james_rule != 0) {
    dVar69 = exp(-800.0 / dVar5);
    pvVar10->expinternal[2] = dVar69;
  }
  dVar69 = (double)niniodH;
  iVar9 = niniodH - ninio37;
  lVar11 = 0;
  do {
    dVar70 = (double)(int)lVar11 * (dVar69 - (double)iVar9 * dVar7);
    dVar6 = (double)MAX_NINIO;
    if (dVar70 <= (double)MAX_NINIO) {
      dVar6 = dVar70;
    }
    dVar6 = exp((dVar6 * -10.0) / dVar5);
    pvVar10->expninio[2][lVar11] = dVar6;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x1f);
  if (Tetraloops[0] != '\0') {
    uVar19 = 0;
    uVar51 = 7;
    do {
      dVar69 = (double)TetraloopdH[uVar19] -
               (double)(TetraloopdH[uVar19] - Tetraloop37[uVar19]) * dVar7;
      if (iVar3 == 0) {
        dVar69 = (double)(int)dVar69;
      }
      dVar69 = exp((dVar69 * -10.0) / dVar5);
      pvVar10->exptetra[uVar19] = dVar69;
      uVar19 = (ulong)((int)uVar19 + 1);
      sVar12 = strlen(Tetraloops);
      bVar4 = uVar51 < sVar12;
      uVar51 = (ulong)((int)uVar51 + 7);
    } while (bVar4);
  }
  if (Triloops[0] != '\0') {
    uVar19 = 0;
    uVar51 = 5;
    do {
      dVar69 = (double)TriloopdH[uVar19] - (double)(TriloopdH[uVar19] - Triloop37[uVar19]) * dVar7;
      if (iVar3 == 0) {
        dVar69 = (double)(int)dVar69;
      }
      dVar69 = exp((dVar69 * -10.0) / dVar5);
      pvVar10->exptri[uVar19] = dVar69;
      uVar19 = (ulong)((int)uVar19 + 1);
      sVar12 = strlen(Triloops);
      bVar4 = uVar51 < sVar12;
      uVar51 = (ulong)((int)uVar51 + 5);
    } while (bVar4);
  }
  if (Hexaloops[0] != '\0') {
    uVar18 = 0;
    uVar51 = 9;
    do {
      dVar69 = (double)HexaloopdH[uVar18] -
               (double)(HexaloopdH[uVar18] - Hexaloop37[uVar18]) * dVar7;
      if (iVar3 == 0) {
        dVar69 = (double)(int)dVar69;
      }
      dVar69 = exp((dVar69 * -10.0) / dVar5);
      pvVar10->exphex[uVar18] = dVar69;
      uVar18 = uVar18 + 1;
      sVar12 = strlen(Hexaloops);
      bVar4 = uVar51 < sVar12;
      uVar51 = (ulong)((int)uVar51 + 9);
    } while (bVar4);
  }
  lVar11 = 0xc7fb;
  do {
    dVar69 = (double)ML_interndH - (double)(ML_interndH - ML_intern37) * dVar7;
    if (iVar3 == 0) {
      dVar69 = (double)(int)dVar69;
    }
    dVar69 = exp((dVar69 * -10.0) / dVar5);
    *(double *)((long)(pvVar10->expstack + -1) + 0x38 + lVar11 * 8) = dVar69;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0xc803);
  padVar20 = pvVar10->expdangle5;
  local_130 = dangle5_dH;
  paiVar58 = dangle5_37;
  paiVar36 = dangle3_dH;
  paiVar47 = dangle3_37;
  lVar11 = 0;
  do {
    lVar52 = 0;
    do {
      if (md->dangles == 0) {
        *(undefined8 *)((long)*padVar20 + lVar52 * 2) = 0x3ff0000000000000;
        uVar67 = 0;
        uVar68 = 0x3ff00000;
      }
      else {
        iVar9 = *(int *)((long)*local_130 + lVar52);
        dVar69 = (double)iVar9 - (double)(iVar9 - *(int *)((long)*paiVar58 + lVar52)) * dVar7;
        if (iVar3 == 0) {
          dVar6 = 0.0;
          if ((int)dVar69 < 1) {
            dVar6 = -(double)(int)dVar69;
          }
        }
        else {
          dVar70 = dVar69 / -10.0;
          dVar6 = 0.0;
          if (-1.2283697 <= dVar70) {
            if (dVar70 <= 0.8660254) {
              dVar69 = sin(dVar70 + -0.34242663);
              iVar9 = *(int *)((long)*local_130 + lVar52);
              dVar6 = sin(((double)iVar9 -
                          (double)(iVar9 - *(int *)((long)*paiVar58 + lVar52)) * dVar7) / -10.0 +
                          -0.34242663);
              dVar6 = (dVar6 + 1.0) * (dVar69 + 1.0) * 3.8490018;
            }
            else {
              dVar6 = -dVar69;
            }
          }
        }
        dVar69 = exp((dVar6 * 10.0) / dVar5);
        *(double *)((long)*padVar20 + lVar52 * 2) = dVar69;
        iVar9 = *(int *)((long)*paiVar36 + lVar52);
        dVar69 = (double)iVar9 - (double)(iVar9 - *(int *)((long)*paiVar47 + lVar52)) * dVar7;
        if (iVar3 == 0) {
          dVar6 = 0.0;
          if ((int)dVar69 < 1) {
            dVar6 = -(double)(int)dVar69;
          }
        }
        else {
          dVar70 = dVar69 / -10.0;
          dVar6 = 0.0;
          if (-1.2283697 <= dVar70) {
            if (dVar70 <= 0.8660254) {
              dVar69 = sin(dVar70 + -0.34242663);
              iVar9 = *(int *)((long)*paiVar36 + lVar52);
              dVar6 = sin(((double)iVar9 -
                          (double)(iVar9 - *(int *)((long)*paiVar47 + lVar52)) * dVar7) / -10.0 +
                          -0.34242663);
              dVar6 = (dVar6 + 1.0) * (dVar69 + 1.0) * 3.8490018;
            }
            else {
              dVar6 = -dVar69;
            }
          }
        }
        dVar69 = exp((dVar6 * 10.0) / dVar5);
        uVar67 = SUB84(dVar69,0);
        uVar68 = (undefined4)((ulong)dVar69 >> 0x20);
      }
      *(ulong *)((long)padVar20[8] + lVar52 * 2) = CONCAT44(uVar68,uVar67);
      lVar52 = lVar52 + 4;
    } while (lVar52 != 0x14);
    lVar11 = lVar11 + 1;
    padVar20 = padVar20 + 1;
    local_130 = local_130 + 1;
    paiVar58 = paiVar58 + 1;
    paiVar36 = paiVar36 + 1;
    paiVar47 = paiVar47 + 1;
  } while (lVar11 != 8);
  padVar21 = pvVar10->expstack;
  paiVar53 = stackdH;
  paiVar59 = stack37;
  lVar11 = 0;
  do {
    lVar52 = 0;
    do {
      iVar9 = *(int *)((long)*paiVar53 + lVar52);
      dVar69 = (double)iVar9 - (double)(iVar9 - *(int *)((long)*paiVar59 + lVar52)) * dVar7;
      if (iVar3 == 0) {
        dVar69 = (double)(int)dVar69;
      }
      dVar69 = exp((dVar69 * -10.0) / dVar5);
      *(double *)((long)*padVar21 + lVar52 * 2) = dVar69;
      lVar52 = lVar52 + 4;
    } while (lVar52 != 0x20);
    lVar11 = lVar11 + 1;
    paiVar53 = paiVar53 + 1;
    paiVar59 = paiVar59 + 1;
    padVar21 = padVar21 + 1;
  } while (lVar11 != 8);
  paaiVar48 = mismatchIdH;
  paaiVar22 = mismatchI37;
  paaiVar54 = mismatch1nIdH;
  paaiVar13 = mismatch1nI37;
  paaiVar15 = mismatchHdH;
  paaiVar16 = mismatchH37;
  paaiVar30 = mismatch23IdH;
  paaiVar31 = mismatch23I37;
  paaiVar32 = mismatchMdH;
  paaiVar33 = mismatchM37;
  paaiVar34 = mismatchExtdH;
  paaiVar35 = mismatchExt37;
  lVar11 = 0;
  pvVar37 = pvVar10;
  do {
    lVar52 = 0;
    paiVar36 = *paaiVar22;
    pvVar38 = pvVar37;
    paiVar47 = *paaiVar48;
    paiVar58 = *paaiVar54;
    local_130 = *paaiVar31;
    local_100 = *paaiVar30;
    local_f0 = *paaiVar16;
    local_e8 = *paaiVar15;
    local_e0 = *paaiVar34;
    local_d8 = *paaiVar35;
    local_c8 = *paaiVar13;
    local_b8 = *paaiVar32;
    local_b0 = *paaiVar33;
    do {
      lVar60 = 0;
      do {
        iVar9 = *(int *)((long)*(int (*) [5])*paiVar47 + lVar60);
        dVar69 = (double)iVar9 -
                 (double)(iVar9 - *(int *)((long)*(int (*) [5])*paiVar36 + lVar60)) * dVar7;
        if (iVar3 == 0) {
          dVar69 = (double)(int)dVar69;
        }
        dVar69 = exp((dVar69 * -10.0) / dVar5);
        *(double *)((long)pvVar38->expmismatchI[0][0] + lVar60 * 2) = dVar69;
        iVar9 = *(int *)((long)*(int (*) [5])*paiVar58 + lVar60);
        dVar69 = (double)iVar9 -
                 (double)(iVar9 - *(int *)((long)*(int (*) [5])*local_c8 + lVar60)) * dVar7;
        if (iVar3 == 0) {
          dVar69 = (double)(int)dVar69;
        }
        dVar69 = exp((dVar69 * -10.0) / dVar5);
        *(double *)((long)pvVar38->expmismatch1nI[0][0] + lVar60 * 2) = dVar69;
        iVar9 = *(int *)((long)*(int (*) [5])*local_e8 + lVar60);
        dVar69 = (double)iVar9 -
                 (double)(iVar9 - *(int *)((long)*(int (*) [5])*local_f0 + lVar60)) * dVar7;
        if (iVar3 == 0) {
          dVar69 = (double)(int)dVar69;
        }
        dVar69 = exp((dVar69 * -10.0) / dVar5);
        *(double *)((long)pvVar38->expmismatchH[0][0] + lVar60 * 2) = dVar69;
        iVar9 = *(int *)((long)*(int (*) [5])*local_100 + lVar60);
        dVar69 = (double)iVar9 -
                 (double)(iVar9 - *(int *)((long)*(int (*) [5])*local_130 + lVar60)) * dVar7;
        if (iVar3 == 0) {
          dVar69 = (double)(int)dVar69;
        }
        dVar69 = exp((dVar69 * -10.0) / dVar5);
        *(double *)((long)pvVar38->expmismatch23I[0][0] + lVar60 * 2) = dVar69;
        if (md->dangles == 0) {
          *(undefined8 *)((long)pvVar38->expmismatchExt[0][0] + lVar60 * 2) = 0x3ff0000000000000;
          lVar14 = 0x2430;
          uVar67 = 0;
          uVar68 = 0x3ff00000;
        }
        else {
          iVar9 = *(int *)((long)*(int (*) [5])*local_b8 + lVar60);
          dVar69 = (double)iVar9 -
                   (double)(iVar9 - *(int *)((long)*(int (*) [5])*local_b0 + lVar60)) * dVar7;
          if (iVar3 == 0) {
            dVar6 = 0.0;
            if ((int)dVar69 < 1) {
              dVar6 = -(double)(int)dVar69;
            }
          }
          else {
            dVar70 = dVar69 / -10.0;
            dVar6 = 0.0;
            if (-1.2283697 <= dVar70) {
              if (dVar70 <= 0.8660254) {
                dVar69 = sin(dVar70 + -0.34242663);
                iVar9 = *(int *)((long)*(int (*) [5])*local_b8 + lVar60);
                dVar6 = sin(((double)iVar9 -
                            (double)(iVar9 - *(int *)((long)*(int (*) [5])*local_b0 + lVar60)) *
                            dVar7) / -10.0 + -0.34242663);
                dVar6 = (dVar6 + 1.0) * (dVar69 + 1.0) * 3.8490018;
              }
              else {
                dVar6 = -dVar69;
              }
            }
          }
          dVar69 = exp((dVar6 * 10.0) / dVar5);
          *(double *)((long)pvVar38->expmismatchM[0][0] + lVar60 * 2) = dVar69;
          iVar9 = *(int *)((long)*(int (*) [5])*local_e0 + lVar60);
          dVar69 = (double)iVar9 -
                   (double)(iVar9 - *(int *)((long)*(int (*) [5])*local_d8 + lVar60)) * dVar7;
          if (iVar3 == 0) {
            dVar6 = 0.0;
            if ((int)dVar69 < 1) {
              dVar6 = -(double)(int)dVar69;
            }
          }
          else {
            dVar70 = dVar69 / -10.0;
            dVar6 = 0.0;
            if (-1.2283697 <= dVar70) {
              if (dVar70 <= 0.8660254) {
                dVar69 = sin(dVar70 + -0.34242663);
                iVar9 = *(int *)((long)*(int (*) [5])*local_e0 + lVar60);
                dVar6 = sin(((double)iVar9 -
                            (double)(iVar9 - *(int *)((long)*(int (*) [5])*local_d8 + lVar60)) *
                            dVar7) / -10.0 + -0.34242663);
                dVar6 = (dVar6 + 1.0) * (dVar69 + 1.0) * 3.8490018;
              }
              else {
                dVar6 = -dVar69;
              }
            }
          }
          dVar69 = exp((dVar6 * 10.0) / dVar5);
          uVar67 = SUB84(dVar69,0);
          uVar68 = (undefined4)((ulong)dVar69 >> 0x20);
          lVar14 = 0x4f0;
        }
        *(ulong *)((long)(pvVar38->expstack + -1) + 0x38 + lVar60 * 2 + lVar14) =
             CONCAT44(uVar68,uVar67);
        lVar60 = lVar60 + 4;
      } while (lVar60 != 0x14);
      lVar52 = lVar52 + 1;
      pvVar38 = (vrna_exp_param_t *)(pvVar38->expstack[0] + 4);
      paiVar47 = paiVar47 + 1;
      paiVar36 = paiVar36 + 1;
      paiVar58 = paiVar58 + 1;
      local_c8 = local_c8 + 1;
      local_e8 = local_e8 + 1;
      local_f0 = local_f0 + 1;
      local_100 = local_100 + 1;
      local_130 = local_130 + 1;
      local_b8 = local_b8 + 1;
      local_b0 = local_b0 + 1;
      local_e0 = local_e0 + 1;
      local_d8 = local_d8 + 1;
    } while (lVar52 != 5);
    lVar11 = lVar11 + 1;
    pvVar37 = (vrna_exp_param_t *)(pvVar37->expstack + 3);
    paaiVar48 = (int (*) [5] [5])((long)paaiVar48 + 100);
    paaiVar22 = (int (*) [5] [5])((long)paaiVar22 + 100);
    paaiVar54 = (int (*) [5] [5])((long)paaiVar54 + 100);
    paaiVar13 = (int (*) [5] [5])((long)paaiVar13 + 100);
    paaiVar15 = (int (*) [5] [5])((long)paaiVar15 + 100);
    paaiVar16 = (int (*) [5] [5])((long)paaiVar16 + 100);
    paaiVar30 = (int (*) [5] [5])((long)paaiVar30 + 100);
    paaiVar31 = (int (*) [5] [5])((long)paaiVar31 + 100);
    paaiVar32 = (int (*) [5] [5])((long)paaiVar32 + 100);
    paaiVar33 = (int (*) [5] [5])((long)paaiVar33 + 100);
    paaiVar34 = (int (*) [5] [5])((long)paaiVar34 + 100);
    paaiVar35 = (int (*) [5] [5])((long)paaiVar35 + 100);
  } while (lVar11 != 8);
  paaadVar23 = pvVar10->expint11;
  paaaiVar55 = int11_dH;
  paaaiVar61 = int11_37;
  lVar11 = 0;
  do {
    lVar52 = 0;
    paaadVar24 = paaadVar23;
    paiVar36 = (int (*) [5])paaaiVar55;
    paiVar47 = (int (*) [5])paaaiVar61;
    do {
      lVar60 = 0;
      paaadVar25 = paaadVar24;
      paiVar58 = paiVar36;
      paiVar64 = paiVar47;
      do {
        lVar14 = 0;
        do {
          iVar9 = (*(int (*) [5] [5])*paiVar58)[0][lVar14];
          dVar69 = (double)iVar9 -
                   (double)(iVar9 - (*(int (*) [5] [5])*paiVar64)[0][lVar14]) * dVar7;
          if (iVar3 == 0) {
            dVar69 = (double)(int)dVar69;
          }
          dVar69 = exp((dVar69 * -10.0) / dVar5);
          (*paaadVar25)[0][0][lVar14] = dVar69;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 5);
        lVar60 = lVar60 + 1;
        paiVar58 = paiVar58 + 1;
        paiVar64 = paiVar64 + 1;
        paaadVar25 = (double (*) [8] [5] [5])((*paaadVar25)[0] + 1);
      } while (lVar60 != 5);
      lVar52 = lVar52 + 1;
      paiVar36 = paiVar36 + 5;
      paiVar47 = paiVar47 + 5;
      paaadVar24 = (double (*) [8] [5] [5])(*paaadVar24 + 1);
    } while (lVar52 != 8);
    lVar11 = lVar11 + 1;
    paaaiVar55 = (int (*) [8] [5] [5])((long)paaaiVar55 + 800);
    paaaiVar61 = (int (*) [8] [5] [5])((long)paaaiVar61 + 800);
    paaadVar23 = paaadVar23 + 1;
  } while (lVar11 != 8);
  paaaadVar26 = pvVar10->expint21;
  paaaaiVar39 = int21_dH;
  paaaaiVar62 = int21_37;
  lVar11 = 0;
  do {
    lVar52 = 0;
    paaaadVar27 = paaaadVar26;
    paiVar36 = (int (*) [5])paaaaiVar39;
    paiVar47 = (int (*) [5])paaaaiVar62;
    do {
      lVar60 = 0;
      paaaadVar28 = paaaadVar27;
      paiVar58 = paiVar36;
      paiVar64 = paiVar47;
      do {
        lVar14 = 0;
        paaaadVar29 = paaaadVar28;
        paiVar40 = paiVar58;
        paiVar65 = paiVar64;
        do {
          lVar49 = 0;
          do {
            iVar9 = (*(int (*) [5] [5] [5])*paiVar40)[0][0][lVar49];
            dVar69 = (double)iVar9 -
                     (double)(iVar9 - (*(int (*) [5] [5] [5])*paiVar65)[0][0][lVar49]) * dVar7;
            if (iVar3 == 0) {
              dVar69 = (double)(int)dVar69;
            }
            dVar69 = exp((dVar69 * -10.0) / dVar5);
            (*paaaadVar29)[0][0][0][lVar49] = dVar69;
            lVar49 = lVar49 + 1;
          } while (lVar49 != 5);
          lVar14 = lVar14 + 1;
          paiVar40 = paiVar40 + 1;
          paiVar65 = paiVar65 + 1;
          paaaadVar29 = (double (*) [8] [5] [5] [5])((*paaaadVar29)[0][0] + 1);
        } while (lVar14 != 5);
        lVar60 = lVar60 + 1;
        paiVar58 = paiVar58 + 5;
        paiVar64 = paiVar64 + 5;
        paaaadVar28 = (double (*) [8] [5] [5] [5])((*paaaadVar28)[0] + 1);
      } while (lVar60 != 5);
      lVar52 = lVar52 + 1;
      paiVar36 = paiVar36 + 0x19;
      paiVar47 = paiVar47 + 0x19;
      paaaadVar27 = (double (*) [8] [5] [5] [5])(*paaaadVar27 + 1);
    } while (lVar52 != 8);
    lVar11 = lVar11 + 1;
    paaaaiVar39 = (int (*) [8] [5] [5] [5])((long)paaaaiVar39 + 4000);
    paaaaiVar62 = (int (*) [8] [5] [5] [5])((long)paaaaiVar62 + 4000);
    paaaadVar26 = paaaadVar26 + 1;
  } while (lVar11 != 8);
  paaaaadVar41 = pvVar10->expint22;
  paaaaaiVar56 = int22_dH;
  paaaaaiVar63 = int22_37;
  lVar11 = 0;
  do {
    lVar52 = 0;
    paaaaadVar42 = paaaaadVar41;
    paiVar36 = (int (*) [5])paaaaaiVar56;
    paiVar47 = (int (*) [5])paaaaaiVar63;
    do {
      lVar60 = 0;
      paaaaadVar43 = paaaaadVar42;
      paiVar58 = paiVar36;
      paiVar64 = paiVar47;
      do {
        lVar14 = 0;
        paaaaadVar44 = paaaaadVar43;
        paiVar40 = paiVar58;
        paiVar65 = paiVar64;
        do {
          lVar49 = 0;
          paaaaadVar45 = paaaaadVar44;
          paiVar57 = paiVar40;
          paiVar66 = paiVar65;
          do {
            lVar50 = 0;
            do {
              iVar9 = (*(int (*) [5] [5] [5] [5])*paiVar57)[0][0][0][lVar50];
              dVar69 = (double)iVar9 -
                       (double)(iVar9 - (*(int (*) [5] [5] [5] [5])*paiVar66)[0][0][0][lVar50]) *
                       dVar7;
              if (iVar3 == 0) {
                dVar69 = (double)(int)dVar69;
              }
              dVar69 = exp((dVar69 * -10.0) / dVar5);
              (*paaaaadVar45)[0][0][0][0][lVar50] = dVar69;
              lVar50 = lVar50 + 1;
            } while (lVar50 != 5);
            lVar49 = lVar49 + 1;
            paiVar57 = paiVar57 + 1;
            paiVar66 = paiVar66 + 1;
            paaaaadVar45 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar45)[0][0][0] + 1);
          } while (lVar49 != 5);
          lVar14 = lVar14 + 1;
          paiVar40 = paiVar40 + 5;
          paiVar65 = paiVar65 + 5;
          paaaaadVar44 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar44)[0][0] + 1);
        } while (lVar14 != 5);
        lVar60 = lVar60 + 1;
        paiVar58 = paiVar58 + 0x19;
        paiVar64 = paiVar64 + 0x19;
        paaaaadVar43 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar43)[0] + 1);
      } while (lVar60 != 5);
      lVar52 = lVar52 + 1;
      paiVar36 = paiVar36 + 0x7d;
      paiVar47 = paiVar47 + 0x7d;
      paaaaadVar42 = (double (*) [8] [5] [5] [5] [5])(*paaaaadVar42 + 1);
    } while (lVar52 != 8);
    lVar11 = lVar11 + 1;
    paaaaaiVar56 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar56 + 20000);
    paaaaaiVar63 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar63 + 20000);
    paaaaadVar41 = paaaaadVar41 + 1;
  } while (lVar11 != 8);
  strncpy(pvVar10->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar10->Triloops,Triloops,0xf1);
  strncpy(pvVar10->Hexaloops,Hexaloops,0x169);
  return pvVar10;
}

Assistant:

PRIVATE vrna_exp_param_t *
get_exp_params_ali(vrna_md_t    *md,
                   unsigned int n_seq,
                   double       pfs)
{
  /* scale energy parameters and pre-calculate Boltzmann weights */
  unsigned int      i, j, k, l;
  int               pf_smooth;
  double            kTn, TT;
  double            GT;
  vrna_exp_param_t  *pf;

  pf                = (vrna_exp_param_t *)vrna_alloc(sizeof(vrna_exp_param_t));
  pf->model_details = *md;
  pf->alpha         = md->betaScale;
  pf->temperature   = md->temperature;
  pf->pf_scale      = pfs;
  pf->kT            = kTn = ((double)n_seq) * md->betaScale * (md->temperature + K0) * GASCONST; /* kT in cal/mol  */
  pf_smooth         = md->pf_smooth;
  TT                = (md->temperature + K0) / (Tmeasure);

  pf->lxc                   = lxc37 * TT;
  pf->expDuplexInit         = RESCALE_BF(DuplexInit37, DuplexInitdH, TT, kTn);
  pf->expTermAU             = RESCALE_BF(TerminalAU37, TerminalAUdH, TT, kTn);
  pf->expMLbase             = RESCALE_BF(ML_BASE37, ML_BASEdH, TT, kTn / n_seq);
  pf->expMLclosing          = RESCALE_BF(ML_closing37, ML_closingdH, TT, kTn);
  pf->expgquadLayerMismatch = RESCALE_BF(GQuadLayerMismatch37, GQuadLayerMismatchH, TT, kTn);
  pf->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, TT);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, TT);
      GT = ((double)GQuadAlpha_T) * ((double)(i - 1)) + ((double)GQuadBeta_T) *
           log(((double)j) - 2.);
      pf->expgquad[i][j] = exp(-TRUNC_MAYBE(GT) * 10. / kTn);
    }

  /* loop energies: hairpins, bulges, interior, mulit-loops */
  for (i = 0; i < 31; i++)
    pf->exphairpin[i] = RESCALE_BF(hairpin37[i], hairpindH[i], TT, kTn);
  /*add penalty for too short hairpins*/
  for (i = 0; i < 3; i++) {
    GT                = 600 /*Penalty*/ * TT;
    pf->exphairpin[i] = exp(-GT * 10. / kTn);
  }

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    pf->expbulge[i]     = RESCALE_BF(bulge37[i], bulgedH[i], TT, kTn);
    pf->expinternal[i]  = RESCALE_BF(internal_loop37[i], internal_loopdH[i], TT, kTn);
  }

  /* special case of size 2 interior loops (single mismatch) */
  if (james_rule)
    pf->expinternal[2] = exp(-80 * 10. / kTn);

  GT = RESCALE_dG(bulge37[30], bulgedH[30], TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expbulge[i] = exp(-(GT + (pf->lxc * log(i / 30.))) * 10. / kTn);

  GT = RESCALE_dG(internal_loop37[30], internal_loopdH[30], TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expinternal[i] = exp(-(GT + (pf->lxc * log(i / 30.))) * 10. / kTn);

  GT = RESCALE_dG(ninio37, niniodH, TT);
  for (j = 0; j <= MAXLOOP; j++)
    pf->expninio[2][j] = exp(-MIN2(MAX_NINIO, j * GT) * 10. / kTn);

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    pf->exptetra[i] = RESCALE_BF(Tetraloop37[i], TetraloopdH[i], TT, kTn);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    pf->exptri[i] = RESCALE_BF(Triloop37[i], TriloopdH[i], TT, kTn);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    pf->exphex[i] = RESCALE_BF(Hexaloop37[i], HexaloopdH[i], TT, kTn);

  for (i = 0; i <= NBPAIRS; i++)
    /* includes AU penalty */
    pf->expMLintern[i] = RESCALE_BF(ML_intern37, ML_interndH, TT, kTn);

  /* if dangle_model==0 just set their energy to 0,
   * don't let dangle energies become > 0 (at large temps),
   * but make sure go smoothly to 0                        */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= 4; j++) {
      if (md->dangles) {
        pf->expdangle5[i][j] = RESCALE_BF_SMOOTH(dangle5_37[i][j],
                                                 dangle5_dH[i][j],
                                                 TT,
                                                 kTn);
        pf->expdangle3[i][j] = RESCALE_BF_SMOOTH(dangle3_37[i][j],
                                                 dangle3_dH[i][j],
                                                 TT,
                                                 kTn);
      } else {
        pf->expdangle3[i][j] = pf->expdangle5[i][j] = 1;
      }
    }

  /* stacking energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++) {
      pf->expstack[i][j] = RESCALE_BF(stack37[i][j],
                                      stackdH[i][j],
                                      TT,
                                      kTn);
    }

  /* mismatch energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        pf->expmismatchI[i][j][k] = RESCALE_BF(mismatchI37[i][j][k],
                                               mismatchIdH[i][j][k],
                                               TT,
                                               kTn);
        pf->expmismatch1nI[i][j][k] = RESCALE_BF(mismatch1nI37[i][j][k],
                                                 mismatch1nIdH[i][j][k],
                                                 TT,
                                                 kTn);
        pf->expmismatchH[i][j][k] = RESCALE_BF(mismatchH37[i][j][k],
                                               mismatchHdH[i][j][k],
                                               TT,
                                               kTn);
        pf->expmismatch23I[i][j][k] = RESCALE_BF(mismatch23I37[i][j][k],
                                                 mismatch23IdH[i][j][k],
                                                 TT,
                                                 kTn);

        if (md->dangles) {
          pf->expmismatchM[i][j][k] = RESCALE_BF_SMOOTH(mismatchM37[i][j][k],
                                                        mismatchMdH[i][j][k],
                                                        TT,
                                                        kTn);
          pf->expmismatchExt[i][j][k] = RESCALE_BF_SMOOTH(mismatchExt37[i][j][k],
                                                          mismatchExtdH[i][j][k],
                                                          TT,
                                                          kTn);
        } else {
          pf->expmismatchM[i][j][k] = pf->expmismatchExt[i][j][k] = 1.;
        }
      }

  /* interior lops of length 2 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          pf->expint11[i][j][k][l] = RESCALE_BF(int11_37[i][j][k][l],
                                                int11_dH[i][j][k][l],
                                                TT,
                                                kTn);
        }

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++) {
            pf->expint21[i][j][k][l][m] = RESCALE_BF(int21_37[i][j][k][l][m],
                                                     int21_dH[i][j][k][l][m],
                                                     TT,
                                                     kTn);
          }
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++) {
              pf->expint22[i][j][k][l][m][n] = RESCALE_BF(int22_37[i][j][k][l][m][n],
                                                          int22_dH[i][j][k][l][m][n],
                                                          TT,
                                                          kTn);
            }
        }

  strncpy(pf->Tetraloops, Tetraloops, 281);
  strncpy(pf->Triloops, Triloops, 241);
  strncpy(pf->Hexaloops, Hexaloops, 361);

  return pf;
}